

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O2

void axl::sl::shlBitMap(size_t *map,size_t pageCount,size_t n)

{
  byte bVar1;
  size_t __n;
  size_t *psVar2;
  ulong uVar3;
  
  if (n == 0) {
    return;
  }
  uVar3 = n >> 6;
  if (pageCount < uVar3 || pageCount - uVar3 == 0) {
    __n = pageCount << 3;
  }
  else {
    if ((n & 0x3f) == 0) {
      memmove(map + uVar3,map,(pageCount - uVar3) * 8);
    }
    else {
      psVar2 = map + pageCount;
      while( true ) {
        if (psVar2 + (-2 - uVar3) < map) break;
        bVar1 = (byte)n & 0x3f;
        psVar2[-1] = psVar2[-1 - uVar3] << bVar1 | psVar2[-2 - uVar3] >> 0x40 - bVar1;
        psVar2 = psVar2 + -1;
      }
      psVar2[-1] = psVar2[-1 - uVar3] << (sbyte)(n & 0x3f);
      if (n < 0x40) {
        return;
      }
    }
    __n = uVar3 << 3;
  }
  memset(map,0,__n);
  return;
}

Assistant:

void
shlBitMap(
	size_t* map,
	size_t pageCount,
	size_t n
) {
	if (!n)
		return;

	size_t i = n / AXL_PTR_BITS;
	if (i >= pageCount) {
		memset(map, 0, pageCount * sizeof(size_t));
		return;
	}

	n &= AXL_PTR_BITS - 1;
	if (!n) {
		memmove(map + i, map, (pageCount - i) * sizeof(size_t));
		memset(map, 0, i * sizeof(size_t));
		return;
	}

	size_t c = AXL_PTR_BITS - n;
	size_t* dst = map + pageCount - 1;
	size_t* src = dst - i;
	size_t* prev = src - 1;
	while (prev >= map) {
		*dst-- = (*src << n) | (*prev >> c);
		src = prev--;
	}

	*dst = *src << n;

	if (i)
		memset(map, 0, i * sizeof(size_t));
}